

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-watcher-cross-stop.c
# Opt level: O2

int run_test_watcher_cross_stop(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  char *pcVar3;
  uv_udp_send_t *req;
  uv_udp_t *handle;
  long lVar4;
  undefined8 uStack_460;
  uv_buf_t local_458;
  sockaddr_in addr;
  char big_string [1024];
  
  puVar2 = uv_default_loop();
  big_string[0] = -0x1c;
  big_string[1] = '\t';
  big_string[2] = '\0';
  big_string[3] = '\0';
  big_string[4] = '\0';
  big_string[5] = '\0';
  big_string[6] = '\0';
  big_string[7] = '\0';
  big_string[8] = -0x1c;
  big_string[9] = '\t';
  big_string[10] = '\0';
  big_string[0xb] = '\0';
  big_string[0xc] = '\0';
  big_string[0xd] = '\0';
  big_string[0xe] = '\0';
  big_string[0xf] = '\0';
  iVar1 = setrlimit64(RLIMIT_NOFILE,(rlimit64 *)big_string);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s\n","File descriptor limit too low.");
    fflush(_stderr);
    return 1;
  }
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
  if (iVar1 == 0) {
    memset(big_string,0x41,0x400);
    local_458 = uv_buf_init(big_string,0x400);
    req = reqs;
    lVar4 = 0;
    do {
      if (lVar4 + 0xd8 == 0x83e38) goto LAB_00168f52;
      handle = (uv_udp_t *)((long)sockets[0].handle_queue + lVar4 + -0x20);
      iVar1 = uv_udp_init(puVar2,handle);
      if (iVar1 != 0) {
        pcVar3 = "0 == uv_udp_init(loop, &sockets[i])";
        uStack_460 = 0x53;
        goto LAB_001690ae;
      }
      iVar1 = uv_udp_bind(handle,(sockaddr *)&addr,4);
      if (iVar1 != 0) {
        pcVar3 = "0 == uv_udp_bind(&sockets[i], (const struct sockaddr*) &addr, UV_UDP_REUSEADDR)";
        uStack_460 = 0x56;
        goto LAB_001690ae;
      }
      iVar1 = uv_udp_recv_start(handle,alloc_cb,recv_cb);
      if (iVar1 != 0) {
        pcVar3 = "0 == uv_udp_recv_start(&sockets[i], alloc_cb, recv_cb)";
        uStack_460 = 0x57;
        goto LAB_001690ae;
      }
      iVar1 = uv_udp_send(req,handle,&local_458,1,(sockaddr *)&addr,send_cb);
      req = req + 1;
      lVar4 = lVar4 + 0xd8;
    } while (iVar1 == 0);
    pcVar3 = 
    "0 == uv_udp_send(&reqs[i], &sockets[i], &buf, 1, (const struct sockaddr*) &addr, send_cb)";
    uStack_460 = 0x5d;
  }
  else {
    pcVar3 = "0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)";
    uStack_460 = 0x4e;
  }
LAB_001690ae:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-watcher-cross-stop.c"
          ,uStack_460,pcVar3);
  abort();
LAB_00168f52:
  while (recv_cb_called == 0) {
    uv_run(puVar2,UV_RUN_ONCE);
  }
  for (lVar4 = 0; lVar4 != 540000; lVar4 = lVar4 + 0xd8) {
    uv_close((uv_handle_t *)((long)sockets[0].handle_queue + lVar4 + -0x20),close_cb);
  }
  if (recv_cb_called == 0) {
    pcVar3 = "recv_cb_called > 0";
    uStack_460 = 0x66;
  }
  else {
    uv_run(puVar2,UV_RUN_DEFAULT);
    if (send_cb_called == 0x9c4) {
      if (close_cb_called == 0x9c4) {
        puVar2 = uv_default_loop();
        uv_walk(puVar2,close_walk_cb,(void *)0x0);
        uv_run(puVar2,UV_RUN_DEFAULT);
        puVar2 = uv_default_loop();
        iVar1 = uv_loop_close(puVar2);
        if (iVar1 == 0) {
          return 0;
        }
        pcVar3 = "0 == uv_loop_close(uv_default_loop())";
        uStack_460 = 0x6d;
      }
      else {
        pcVar3 = "ARRAY_SIZE(sockets) == close_cb_called";
        uStack_460 = 0x6b;
      }
    }
    else {
      pcVar3 = "ARRAY_SIZE(sockets) == send_cb_called";
      uStack_460 = 0x6a;
    }
  }
  goto LAB_001690ae;
}

Assistant:

TEST_IMPL(watcher_cross_stop) {
#if defined(__MVS__)
  RETURN_SKIP("zOS does not allow address or port reuse when using UDP sockets");
#endif
  uv_loop_t* loop = uv_default_loop();
  unsigned int i;
  struct sockaddr_in addr;
  uv_buf_t buf;
  char big_string[1024];

  TEST_FILE_LIMIT(ARRAY_SIZE(sockets) + 32);

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  memset(big_string, 'A', sizeof(big_string));
  buf = uv_buf_init(big_string, sizeof(big_string));

  for (i = 0; i < ARRAY_SIZE(sockets); i++) {
    ASSERT(0 == uv_udp_init(loop, &sockets[i]));
    ASSERT(0 == uv_udp_bind(&sockets[i],
                            (const struct sockaddr*) &addr,
                            UV_UDP_REUSEADDR));
    ASSERT(0 == uv_udp_recv_start(&sockets[i], alloc_cb, recv_cb));
    ASSERT(0 == uv_udp_send(&reqs[i],
                            &sockets[i],
                            &buf,
                            1,
                            (const struct sockaddr*) &addr,
                            send_cb));
  }

  while (recv_cb_called == 0)
    uv_run(loop, UV_RUN_ONCE);

  for (i = 0; i < ARRAY_SIZE(sockets); i++)
    uv_close((uv_handle_t*) &sockets[i], close_cb);

  ASSERT(recv_cb_called > 0);

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(ARRAY_SIZE(sockets) == send_cb_called);
  ASSERT(ARRAY_SIZE(sockets) == close_cb_called);

  MAKE_VALGRIND_HAPPY();
  return 0;
}